

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::GetIndividualFileTargets
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets)

{
  _Rb_tree_node_base *__x;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Base_ptr p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string base;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  localObjectFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long *local_80;
  long local_78;
  long local_70 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  GetLocalObjectFiles(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                            *)&local_60);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    paVar2 = &local_a0.field_2;
    p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      __x = p_Var3 + 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(targets,(value_type *)__x);
      std::__cxx11::string::rfind((char *)__x,0x4c29c4,0xffffffffffffffff);
      std::__cxx11::string::substr((ulong)&local_80,(ulong)__x);
      if (*(char *)((long)&p_Var3[2]._M_right + 1) == '\x01') {
        local_a0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,local_80,local_78 + (long)local_80);
        std::__cxx11::string::append((char *)&local_a0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targets,
                   &local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      if (*(char *)((long)&p_Var3[2]._M_right + 2) == '\x01') {
        local_a0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,local_80,local_78 + (long)local_80);
        std::__cxx11::string::append((char *)&local_a0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targets,
                   &local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::GetIndividualFileTargets
                                            (std::vector<std::string>& targets)
{
  std::map<std::string, LocalObjectInfo> localObjectFiles;
  this->GetLocalObjectFiles(localObjectFiles);
  for (std::map<std::string, LocalObjectInfo>::iterator lo =
         localObjectFiles.begin();
       lo != localObjectFiles.end(); ++lo)
    {
    targets.push_back(lo->first);

    std::string::size_type dot_pos = lo->first.rfind(".");
    std::string base = lo->first.substr(0, dot_pos);
    if(lo->second.HasPreprocessRule)
      {
      targets.push_back(base + ".i");
      }

    if(lo->second.HasAssembleRule)
      {
      targets.push_back(base + ".s");
      }
    }
}